

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

uint rlLoadVertexBuffer(void *buffer,int size,_Bool dynamic)

{
  uint in_EAX;
  undefined7 in_register_00000011;
  uint id;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  (*glad_glGenBuffers)(1,(GLuint *)((long)&uStack_28 + 4));
  (*glad_glBindBuffer)(0x8892,uStack_28._4_4_);
  (*glad_glBufferData)
            (0x8892,(long)size,buffer,(int)CONCAT71(in_register_00000011,dynamic) * 4 + 0x88e4);
  return uStack_28._4_4_;
}

Assistant:

unsigned int rlLoadVertexBuffer(void *buffer, int size, bool dynamic)
{
    unsigned int id = 0;

#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    glGenBuffers(1, &id);
    glBindBuffer(GL_ARRAY_BUFFER, id);
    glBufferData(GL_ARRAY_BUFFER, size, buffer, dynamic? GL_DYNAMIC_DRAW : GL_STATIC_DRAW);
#endif

    return id;
}